

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.hpp
# Opt level: O2

void __thiscall tcu::Exception::~Exception(Exception *this)

{
  *(undefined ***)this = &PTR__Exception_00bc7440;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

virtual				~Exception			(void) throw() {}